

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::TablePrinter::close(TablePrinter *this,int __fd)

{
  char cVar1;
  int in_EAX;
  char local_19;
  
  if (this->m_isOpen == true) {
    if (0 < this->m_currentColumn) {
      local_19 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(this->m_os,&local_19,1);
      this->m_currentColumn = -1;
    }
    cVar1 = (char)this->m_os;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->m_os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    in_EAX = std::ostream::flush();
    this->m_isOpen = false;
  }
  return in_EAX;
}

Assistant:

void close() {
            if (m_isOpen) {
                *this << RowBreak();
                m_os << std::endl;
                m_isOpen = false;
            }
        }